

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_cookie.c
# Opt level: O2

ares_status_t
ares_cookie_validate
          (ares_query_t *query,ares_dns_record_t *dnsresp,ares_conn_t *conn,ares_timeval_t *now,
          ares_array_t **requeue)

{
  ares_cookie_t *paVar1;
  ares_server_t *paVar2;
  ares_dns_record_t *dnsrec;
  uint uVar3;
  undefined4 uVar4;
  ares_dns_rcode_t aVar5;
  long *plVar6;
  long *plVar7;
  ulong uVar8;
  size_t resp_cookie_len;
  size_t req_cookie_len;
  
  paVar2 = conn->server;
  dnsrec = query->query;
  plVar6 = (long *)ares_dns_cookie_fetch(dnsresp,&resp_cookie_len);
  if ((plVar6 != (long *)0x0) && (resp_cookie_len - 0x29 < 0xffffffffffffffdf)) {
    return ARES_EBADRESP;
  }
  plVar7 = (long *)ares_dns_cookie_fetch(dnsrec,&req_cookie_len);
  if (plVar7 == (long *)0x0) {
    return ARES_SUCCESS;
  }
  if (plVar6 != (long *)0x0) {
    if (*plVar7 != *plVar6) {
      return ARES_EBADRESP;
    }
    if (8 < resp_cookie_len) {
      (paVar2->cookie).state = ARES_COOKIE_SUPPORTED;
      (paVar2->cookie).unsupported_ts.sec = 0;
      *(undefined8 *)&(paVar2->cookie).unsupported_ts.usec = 0;
      if (*(long *)(paVar2->cookie).client == *plVar7) {
        (paVar2->cookie).server_len = resp_cookie_len - 8;
        memcpy((paVar2->cookie).server,plVar6 + 1,resp_cookie_len - 8);
      }
    }
  }
  aVar5 = ares_dns_record_get_rcode(dnsresp);
  if (aVar5 == ARES_RCODE_BADCOOKIE) {
    if (plVar6 == (long *)0x0) {
      return ARES_EBADRESP;
    }
    uVar8 = query->cookie_try_count + 1;
    query->cookie_try_count = uVar8;
    if (2 < uVar8) {
      query->using_tcp = ARES_TRUE;
    }
    ares_requeue_query(query,now,ARES_SUCCESS,ARES_FALSE,(ares_dns_record_t *)0x0,requeue);
  }
  else {
    if (8 < resp_cookie_len) {
      return ARES_SUCCESS;
    }
    paVar1 = &paVar2->cookie;
    if (paVar1->state == ARES_COOKIE_GENERATED) {
      (paVar2->cookie).unsupported_ts.sec = 0;
      *(undefined8 *)&(paVar2->cookie).unsupported_ts.usec = 0;
      *(undefined8 *)((paVar2->cookie).server + 0x1c) = 0;
      (paVar2->cookie).server_len = 0;
      (paVar2->cookie).server[0xc] = '\0';
      (paVar2->cookie).server[0xd] = '\0';
      (paVar2->cookie).server[0xe] = '\0';
      (paVar2->cookie).server[0xf] = '\0';
      (paVar2->cookie).server[0x10] = '\0';
      (paVar2->cookie).server[0x11] = '\0';
      (paVar2->cookie).server[0x12] = '\0';
      (paVar2->cookie).server[0x13] = '\0';
      (paVar2->cookie).server[0x14] = '\0';
      (paVar2->cookie).server[0x15] = '\0';
      (paVar2->cookie).server[0x16] = '\0';
      (paVar2->cookie).server[0x17] = '\0';
      (paVar2->cookie).server[0x18] = '\0';
      (paVar2->cookie).server[0x19] = '\0';
      (paVar2->cookie).server[0x1a] = '\0';
      (paVar2->cookie).server[0x1b] = '\0';
      *(undefined8 *)((long)&(paVar2->cookie).client_ip.addr + 0xc) = 0;
      (paVar2->cookie).server[4] = '\0';
      (paVar2->cookie).server[5] = '\0';
      (paVar2->cookie).server[6] = '\0';
      (paVar2->cookie).server[7] = '\0';
      (paVar2->cookie).server[8] = '\0';
      (paVar2->cookie).server[9] = '\0';
      (paVar2->cookie).server[10] = '\0';
      (paVar2->cookie).server[0xb] = '\0';
      *(undefined8 *)&(paVar2->cookie).client_ip = 0;
      *(undefined8 *)((long)&(paVar2->cookie).client_ip.addr + 4) = 0;
      (paVar2->cookie).client_ts.sec = 0;
      *(undefined8 *)&(paVar2->cookie).client_ts.usec = 0;
      paVar1->state = ARES_COOKIE_INITIAL;
      paVar1->client[0] = '\0';
      paVar1->client[1] = '\0';
      paVar1->client[2] = '\0';
      paVar1->client[3] = '\0';
      *(undefined8 *)((paVar2->cookie).client + 4) = 0;
      (paVar2->cookie).state = ARES_COOKIE_UNSUPPORTED;
      uVar3 = now->usec;
      uVar4 = *(undefined4 *)&now->field_0xc;
      (paVar2->cookie).unsupported_ts.sec = now->sec;
      (paVar2->cookie).unsupported_ts.usec = uVar3;
      *(undefined4 *)&(paVar2->cookie).unsupported_ts.field_0xc = uVar4;
      return ARES_SUCCESS;
    }
    if (paVar1->state != ARES_COOKIE_SUPPORTED) {
      return ARES_SUCCESS;
    }
    if (((paVar2->cookie).unsupported_ts.sec == 0) || ((paVar2->cookie).unsupported_ts.usec == 0)) {
      uVar3 = now->usec;
      uVar4 = *(undefined4 *)&now->field_0xc;
      (paVar2->cookie).unsupported_ts.sec = now->sec;
      (paVar2->cookie).unsupported_ts.usec = uVar3;
      *(undefined4 *)&(paVar2->cookie).unsupported_ts.field_0xc = uVar4;
    }
  }
  return ARES_EBADRESP;
}

Assistant:

ares_status_t ares_cookie_validate(ares_query_t            *query,
                                   const ares_dns_record_t *dnsresp,
                                   ares_conn_t *conn, const ares_timeval_t *now,
                                   ares_array_t **requeue)
{
  ares_server_t           *server = conn->server;
  ares_cookie_t           *cookie = &server->cookie;
  const ares_dns_record_t *dnsreq = query->query;
  const unsigned char     *resp_cookie;
  size_t                   resp_cookie_len;
  const unsigned char     *req_cookie;
  size_t                   req_cookie_len;

  resp_cookie = ares_dns_cookie_fetch(dnsresp, &resp_cookie_len);

  /* Invalid cookie length, drop */
  if (resp_cookie && (resp_cookie_len < 8 || resp_cookie_len > 40)) {
    return ARES_EBADRESP;
  }

  req_cookie = ares_dns_cookie_fetch(dnsreq, &req_cookie_len);

  /* Didn't request cookies, so we can stop evaluating */
  if (req_cookie == NULL) {
    return ARES_SUCCESS;
  }

  /* If 8-byte prefix for returned cookie doesn't match the requested cookie,
   * drop for spoofing */
  if (resp_cookie && memcmp(req_cookie, resp_cookie, 8) != 0) {
    return ARES_EBADRESP;
  }

  if (resp_cookie && resp_cookie_len > 8) {
    /* Make sure we record that we successfully received a cookie response */
    cookie->state = ARES_COOKIE_SUPPORTED;
    memset(&cookie->unsupported_ts, 0, sizeof(cookie->unsupported_ts));

    /* If client cookie hasn't been rotated, save the returned server cookie */
    if (memcmp(cookie->client, req_cookie, sizeof(cookie->client)) == 0) {
      cookie->server_len = resp_cookie_len - 8;
      memcpy(cookie->server, resp_cookie + 8, cookie->server_len);
    }
  }

  if (ares_dns_record_get_rcode(dnsresp) == ARES_RCODE_BADCOOKIE) {
    /* Illegal to return BADCOOKIE but no cookie, drop */
    if (resp_cookie == NULL) {
      return ARES_EBADRESP;
    }

    /* If we have too many attempts to send a cookie, we need to requeue as
     * tcp */
    query->cookie_try_count++;
    if (query->cookie_try_count >= COOKIE_RESEND_MAX) {
      query->using_tcp = ARES_TRUE;
    }

    /* Resend the request, hopefully it will work the next time as we should
     * have recorded a server cookie */
    ares_requeue_query(query, now, ARES_SUCCESS,
                       ARES_FALSE /* Don't increment try count */, NULL,
                       requeue);

    /* Parent needs to drop this response */
    return ARES_EBADRESP;
  }

  /* We've got a response with a server cookie, and we've done all the
   * evaluation we can, return success */
  if (resp_cookie_len > 8) {
    return ARES_SUCCESS;
  }

  if (cookie->state == ARES_COOKIE_SUPPORTED) {
    /* If we're not currently tracking an error time yet, start */
    if (!timeval_is_set(&cookie->unsupported_ts)) {
      memcpy(&cookie->unsupported_ts, now, sizeof(cookie->unsupported_ts));
    }
    /* Drop it since we expected a cookie */
    return ARES_EBADRESP;
  }

  if (cookie->state == ARES_COOKIE_GENERATED) {
    ares_cookie_clear(cookie);
    cookie->state = ARES_COOKIE_UNSUPPORTED;
    memcpy(&cookie->unsupported_ts, now, sizeof(cookie->unsupported_ts));
  }

  /* Cookie state should be UNSUPPORTED if we're here */
  return ARES_SUCCESS;
}